

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall
helics::CoreBroker::addAlias(CoreBroker *this,string_view interfaceKey,string_view alias)

{
  size_t size;
  ActionMessage link;
  ActionMessage AStack_e8;
  
  size = interfaceKey._M_len;
  ActionMessage::ActionMessage(&AStack_e8,cmd_add_alias);
  AStack_e8.payload.bufferSize = size;
  if ((AStack_e8.payload.heap != (byte *)interfaceKey._M_str) &&
     (SmallBuffer::reserve(&AStack_e8.payload,size), size != 0)) {
    memcpy(AStack_e8.payload.heap,interfaceKey._M_str,size);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&AStack_e8.stringData,1);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (AStack_e8.stringData.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,
             (AStack_e8.stringData.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,alias._M_str,alias._M_len
            );
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CoreBroker::addAlias(std::string_view interfaceKey, std::string_view alias)
{
    ActionMessage link(CMD_ADD_ALIAS);
    link.name(interfaceKey);
    link.setStringData(alias);
    addActionMessage(std::move(link));
}